

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_FonRangeSize(Cba_Ntk_t *p,int f)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  char *__nptr;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  if (f < 0) {
    __nptr = Abc_NamStr(p->pDesign->pFuns,~f);
    iVar6 = atoi(__nptr);
    return iVar6;
  }
  if (f == 0) {
    __assert_fail("Cba_FonIsReal(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                  ,0x180,"int Cba_FonRange(Cba_Ntk_t *, int)");
  }
  if ((p->vFonRange).nSize < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = Vec_IntGetEntry(&p->vFonRange,f);
  }
  if ((int)uVar4 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  uVar5 = uVar4 >> 1;
  iVar7 = 0;
  iVar6 = 0;
  if (1 < uVar4) {
    pVVar3 = p->pDesign->vHash->vObjs;
    uVar1 = uVar5 * 4;
    uVar2 = pVVar3->nSize;
    if (uVar2 == uVar1 || SBORROW4(uVar2,uVar1) != (int)(uVar2 + uVar5 * -4) < 0) goto LAB_00364b52;
    iVar6 = pVVar3->pArray[uVar1];
  }
  if (1 < uVar4) {
    pVVar3 = p->pDesign->vHash->vObjs;
    if (pVVar3->nSize <= (int)(uVar5 * 4)) {
LAB_00364b52:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    iVar7 = pVVar3->pArray[(ulong)(uVar5 * 4) + 1];
  }
  iVar6 = iVar6 - iVar7;
  iVar7 = -iVar6;
  if (0 < iVar6) {
    iVar7 = iVar6;
  }
  return iVar7 + 1;
}

Assistant:

static inline int            Cba_FonRangeSize( Cba_Ntk_t * p, int f )        { return Cba_FonIsConst(f) ? Cba_FonConstRangeSize(p, f):Cba_NtkRangeSize(p, Cba_FonRange(p, f)); }